

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O3

void __thiscall QWidget::setLayoutDirection(QWidget *this,LayoutDirection direction)

{
  uint uVar1;
  QWidgetPrivate *this_00;
  
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  uVar1 = this_00->high_attributes[0];
  if (direction != LayoutDirectionAuto) {
    if ((uVar1 >> 0x19 & 1) == 0) {
      this_00->high_attributes[0] = uVar1 | 0x2000000;
      QWidgetPrivate::setLayoutDirection_helper(this_00,direction);
      return;
    }
    QWidgetPrivate::setLayoutDirection_helper(this_00,direction);
    return;
  }
  if ((uVar1 >> 0x19 & 1) != 0) {
    this_00->high_attributes[0] = uVar1 & 0xfdffffff;
    QWidgetPrivate::resolveLayoutDirection(this_00);
    return;
  }
  QWidgetPrivate::resolveLayoutDirection(this_00);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }